

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * get_ext(char *path,char *dest)

{
  char *pcVar1;
  char *in_RSI;
  char *e;
  char temp [260];
  char *__dest;
  char local_128 [8];
  char *in_stack_fffffffffffffee0;
  char *local_8;
  
  if (in_RSI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    __dest = local_128;
    pcVar1 = point_basename(in_stack_fffffffffffffee0);
    strcpy(__dest,pcVar1);
    pcVar1 = strrchr(local_128,0x2e);
    clear_path_string(pcVar1,(size_t)__dest);
    local_8 = in_RSI;
    if (pcVar1 != (char *)0x0) {
      strcpy(in_RSI,pcVar1);
    }
  }
  return local_8;
}

Assistant:

char *get_ext(const char *path, char *dest)
{
	if (dest == NULL)
	{
		return NULL;
	}
	char temp[MAX_PATH];
	strcpy(temp, point_basename(path));
	char *e = strrchr(temp, '.');
	clear_path_string(dest, MAX_PATH);
	if (e != NULL)
	{
		strcpy(dest, e);
	}
	return dest;
}